

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O1

ktx_error_code_e
linearTilingCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  undefined4 local_54;
  int local_50;
  int local_4c;
  long local_48 [5];
  
  local_54 = 1;
  local_50 = miplevel;
  local_4c = face;
  (**(code **)((long)userdata + 0xa8))
            (*(undefined8 *)((long)userdata + 0xf8),*(undefined8 *)((long)userdata + 0xf0),&local_54
             ,local_48);
  memcpy((void *)(*(long *)((long)userdata + 0x100) + local_48[0]),pixels,faceLodSize);
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
linearTilingCallback(int miplevel, int face,
                      int width, int height, int depth,
                      ktx_uint64_t faceLodSize,
                      void* pixels, void* userdata)
{
    user_cbdata_linear* ud = (user_cbdata_linear*)userdata;
    VkSubresourceLayout subResLayout;
#if !defined(_MSC_VER) || _MSC_VER >= 1920
    VkImageSubresource subRes = {
      .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
      .mipLevel = miplevel,
      .arrayLayer = face
    };
#else
    VkImageSubresource subRes = {0};
    subRes.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subRes.mipLevel = miplevel;
    subRes.arrayLayer = face;
#endif

    UNUSED(width);
    UNUSED(height);
    UNUSED(depth);

    // Get sub resources layout. Includes row pitch, size,
    // offsets, etc.
    ud->vkFuncs.vkGetImageSubresourceLayout(ud->device, ud->destImage, &subRes,
                                &subResLayout);
    // Copies all images of the miplevel (for array & 3d) or a single face.
    memcpy(ud->dest + subResLayout.offset, pixels, faceLodSize);
    return KTX_SUCCESS;
}